

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ui_keymap_remove(char *title,wchar_t row)

{
  unkuint9 Var1;
  _Bool _Var2;
  uint8_t uVar4;
  undefined5 uVar5;
  keypress kVar3;
  wchar_t mode;
  keypress c;
  wchar_t row_local;
  char *title_local;
  
  _Var2 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar3 = keymap_get_trigger();
  Var1 = kVar3._0_9_;
  kVar3._9_3_ = 0;
  kVar3.type = (int)Var1;
  register0x00000034 = (int)(Var1 >> 0x20);
  register0x00000010 = (char)(Var1 >> 0x40);
  _Var2 = keymap_remove(_Var2 & 1,kVar3);
  if (_Var2) {
    prt("Removed.",L'\x10',L'\0');
  }
  else {
    prt("No keymap to remove!",L'\x10',L'\0');
  }
  prt("Press any key to continue.",L'\x11',L'\0');
  inkey();
  return;
}

Assistant:

static void ui_keymap_remove(const char *title, int row)
{
	struct keypress c;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);

	c = keymap_get_trigger();

	if (keymap_remove(mode, c))
		prt("Removed.", 16, 0);
	else
		prt("No keymap to remove!", 16, 0);

	/* Prompt */
	prt("Press any key to continue.", 17, 0);
	inkey();
}